

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Map<long,_double> * __thiscall
google::protobuf::Map<long,_double>::operator=(Map<long,_double> *this,Map<long,_double> *other)

{
  const_iterator first;
  const_iterator last;
  iterator_base<google::protobuf::Map<long,_double>::KeyValuePair> local_28;
  
  if (this != other) {
    clear(this);
    local_28.m_ = other->elements_;
    InnerMap::iterator_base<google::protobuf::Map<long,_double>::KeyValuePair>::SearchFrom
              (&local_28,(local_28.m_)->index_of_first_non_null_);
    first.it_.m_ = local_28.m_;
    first.it_.node_ = local_28.node_;
    first.it_.bucket_index_ = local_28.bucket_index_;
    last.it_.bucket_index_ = 0;
    last.it_.node_ = (Node *)0x0;
    last.it_.m_ = (InnerMap *)0x0;
    Map<long,double>::insert<google::protobuf::Map<long,double>::const_iterator>
              ((Map<long,double> *)this,first,last);
  }
  return this;
}

Assistant:

Map& operator=(const Map& other) {
    if (this != &other) {
      clear();
      insert(other.begin(), other.end());
    }
    return *this;
  }